

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtilities.cpp
# Opt level: O0

void Rml::StringUtilities::ExpandString(StringList *string_list,String *string,char delimiter)

{
  String *this;
  bool bVar1;
  size_type sVar2;
  char *local_90;
  char *local_88 [3];
  String local_70;
  char *local_50;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  difference_type local_40;
  size_t num_delimiter_values;
  char *end_ptr;
  char *start_ptr;
  char *ptr;
  bool last_char_delimiter;
  char quote;
  String *pSStack_18;
  char delimiter_local;
  String *string_local;
  StringList *string_list_local;
  
  ptr._6_1_ = '\0';
  ptr._5_1_ = 1;
  ptr._7_1_ = delimiter;
  pSStack_18 = string;
  string_local = (String *)string_list;
  num_delimiter_values = ::std::__cxx11::string::c_str();
  end_ptr = (char *)0x0;
  start_ptr = (char *)num_delimiter_values;
  local_48._M_current = (char *)::std::__cxx11::string::begin();
  local_50 = (char *)::std::__cxx11::string::end();
  local_40 = ::std::count<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char>
                       (local_48,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  )local_50,(char *)((long)&ptr + 7));
  this = string_local;
  if (local_40 == 0) {
    StripWhitespace(&local_70,pSStack_18);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this,&local_70);
    ::std::__cxx11::string::~string((string *)&local_70);
  }
  else {
    sVar2 = ::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)string_local);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)this,sVar2 + local_40 + 1);
    for (; *start_ptr != '\0'; start_ptr = start_ptr + 1) {
      if ((((ptr._5_1_ & 1) == 0) || (ptr._6_1_ != '\0')) ||
         ((*start_ptr != '\"' && (*start_ptr != '\'')))) {
        if ((*start_ptr == ptr._6_1_) && (start_ptr[-1] != '\\')) {
          ptr._6_1_ = '\0';
        }
        else if ((*start_ptr == ptr._7_1_) && (ptr._6_1_ == '\0')) {
          if (end_ptr == (char *)0x0) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::emplace_back<>((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)string_local);
          }
          else {
            local_88[0] = (char *)(num_delimiter_values + 1);
            ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<char_const*&,char_const*>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       string_local,&end_ptr,local_88);
          }
          ptr._5_1_ = 1;
          end_ptr = (char *)0x0;
        }
        else {
          bVar1 = IsWhitespace(*start_ptr);
          if ((!bVar1) || (ptr._6_1_ != '\0')) {
            if (end_ptr == (char *)0x0) {
              end_ptr = start_ptr;
            }
            num_delimiter_values = (size_t)start_ptr;
            ptr._5_1_ = 0;
          }
        }
      }
      else {
        ptr._6_1_ = *start_ptr;
      }
    }
    if (end_ptr != (char *)0x0) {
      local_90 = (char *)(num_delimiter_values + 1);
      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const*&,char_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)string_local,
                 &end_ptr,&local_90);
    }
  }
  return;
}

Assistant:

void StringUtilities::ExpandString(StringList& string_list, const String& string, const char delimiter)
{
	char quote = 0;
	bool last_char_delimiter = true;
	const char* ptr = string.c_str();
	const char* start_ptr = nullptr;
	const char* end_ptr = ptr;

	size_t num_delimiter_values = std::count(string.begin(), string.end(), delimiter);
	if (num_delimiter_values == 0)
	{
		string_list.push_back(StripWhitespace(string));
		return;
	}
	string_list.reserve(string_list.size() + num_delimiter_values + 1);

	while (*ptr)
	{
		// Switch into quote mode if the last char was a delimeter ( excluding whitespace )
		// and we're not already in quote mode
		if (last_char_delimiter && !quote && (*ptr == '"' || *ptr == '\''))
		{
			quote = *ptr;
		}
		// Switch out of quote mode if we encounter a quote that hasn't been escaped
		else if (*ptr == quote && *(ptr - 1) != '\\')
		{
			quote = 0;
		}
		// If we encounter a delimiter while not in quote mode, add the item to the list
		else if (*ptr == delimiter && !quote)
		{
			if (start_ptr)
				string_list.emplace_back(start_ptr, end_ptr + 1);
			else
				string_list.emplace_back();
			last_char_delimiter = true;
			start_ptr = nullptr;
		}
		// Otherwise if its not white space or we're in quote mode, advance the pointers
		else if (!IsWhitespace(*ptr) || quote)
		{
			if (!start_ptr)
				start_ptr = ptr;
			end_ptr = ptr;
			last_char_delimiter = false;
		}

		ptr++;
	}

	// If there's data pending, add it.
	if (start_ptr)
		string_list.emplace_back(start_ptr, end_ptr + 1);
}